

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::BriefUnitTestResultPrinter::OnTestEnd
          (BriefUnitTestResultPrinter *this,TestInfo *test_info)

{
  bool bVar1;
  string local_38;
  TimeInMillis local_18;
  
  bVar1 = TestResult::Failed(&test_info->result_);
  if (bVar1) {
    ColoredPrintf(kRed,"[  FAILED  ] ");
    printf("%s.%s",(test_info->test_suite_name_)._M_dataplus._M_p,
           (test_info->name_)._M_dataplus._M_p);
    PrintFullTestCommentIfPresent(test_info);
    if (FLAGS_gtest_print_time == '\x01') {
      local_18 = (test_info->result_).elapsed_time_;
      StreamableToString<long>(&local_38,&local_18);
      printf(" (%s ms)\n",local_38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
    else {
      putchar(10);
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

void BriefUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Failed()) {
    ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
    PrintTestName(test_info.test_suite_name(), test_info.name());
    PrintFullTestCommentIfPresent(test_info);

    if (GTEST_FLAG(print_time)) {
      printf(" (%s ms)\n",
             internal::StreamableToString(test_info.result()->elapsed_time())
                 .c_str());
    } else {
      printf("\n");
    }
    fflush(stdout);
  }
}